

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

void * deMemPool_allocInternal(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  int iVar1;
  MemPage *pMVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  pMVar2 = pool->currentPage;
  iVar1 = pMVar2->bytesAllocated;
  uVar6 = (ulong)alignBytes;
  pvVar3 = (void *)((long)&pMVar2->nextPage + uVar6 + (long)iVar1 + 7 & -uVar6);
  uVar4 = (long)pvVar3 + (numBytes - ((long)&pMVar2[1].capacity + (long)iVar1));
  if ((ulong)(long)(pMVar2->capacity - iVar1) < uVar4) {
    iVar1 = alignBytes - 4;
    if ((int)(alignBytes - 4) < 1) {
      iVar1 = 0;
    }
    iVar5 = pMVar2->capacity * 2;
    if (0x1f9f < iVar5) {
      iVar5 = 0x1fa0;
    }
    iVar1 = (int)numBytes + iVar1;
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    pMVar2 = MemPage_create((long)iVar5);
    if (pMVar2 == (MemPage *)0x0) {
      return (void *)0x0;
    }
    pMVar2->nextPage = pool->currentPage;
    pool->currentPage = pMVar2;
    pvVar3 = (void *)((long)&pMVar2->nextPage + uVar6 + 7 & -uVar6);
    iVar1 = pMVar2->bytesAllocated;
    uVar4 = (long)pvVar3 + (numBytes - (long)(pMVar2 + 1));
  }
  pMVar2->bytesAllocated = (int)uVar4 + iVar1;
  return pvVar3;
}

Assistant:

DE_INLINE void* deMemPool_allocInternal (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	MemPage* curPage = pool->currentPage;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (pool->allowFailing)
	{
		if ((deRandom_getUint32(&pool->failRandom) & 16383) <= 15)
			return DE_NULL;
	}
#endif

#if defined(DE_SUPPORT_DEBUG_POOLS)
	if (pool->enableDebugAllocs)
	{
		DebugAlloc*	header	= DE_NEW(DebugAlloc);
		void*		ptr		= deAlignedMalloc(numBytes, alignBytes);

		if (!header || !ptr)
		{
			deFree(header);
			deAlignedFree(ptr);
			return DE_NULL;
		}

		header->memPtr	= ptr;
		header->next	= pool->debugAllocListHead;
		pool->debugAllocListHead = header;

		return ptr;
	}
#endif

	DE_ASSERT(curPage);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	{
		void*	curPagePtr		= (void*)((deUint8*)(curPage + 1) + curPage->bytesAllocated);
		void*	alignedPtr		= deAlignPtr(curPagePtr, alignBytes);
		size_t	alignPadding	= (size_t)((deUintptr)alignedPtr - (deUintptr)curPagePtr);

		if (numBytes + alignPadding > (size_t)(curPage->capacity - curPage->bytesAllocated))
		{
			/* Does not fit to current page. */
			int		maxAlignPadding		= deMax32(0, ((int)alignBytes)-MEM_PAGE_BASE_ALIGN);
			int		newPageCapacity		= deMax32(deMin32(2*curPage->capacity, MAX_PAGE_SIZE), ((int)numBytes)+maxAlignPadding);

			curPage = MemPage_create((size_t)newPageCapacity);
			if (!curPage)
				return DE_NULL;

			curPage->nextPage	= pool->currentPage;
			pool->currentPage	= curPage;

			DE_ASSERT(curPage->bytesAllocated == 0);

			curPagePtr			= (void*)(curPage + 1);
			alignedPtr			= deAlignPtr(curPagePtr, alignBytes);
			alignPadding		= (size_t)((deUintptr)alignedPtr - (deUintptr)curPagePtr);

			DE_ASSERT(numBytes + alignPadding <= (size_t)curPage->capacity);
		}

		curPage->bytesAllocated += (int)(numBytes + alignPadding);
		return alignedPtr;
	}
}